

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_manager.cpp
# Opt level: O0

void __thiscall jessilib::impl::parser_manager::clear(parser_manager *this)

{
  lock_guard<std::shared_mutex> local_18;
  lock_guard<std::shared_mutex> guard;
  parser_manager *this_local;
  
  guard._M_device = &this->m_mutex;
  std::lock_guard<std::shared_mutex>::lock_guard(&local_18,&this->m_mutex);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>_>_>
  ::clear(&this->m_parsers);
  std::
  set<jessilib::impl::parser_manager::registration,_std::less<jessilib::impl::parser_manager::registration>,_std::allocator<jessilib::impl::parser_manager::registration>_>
  ::clear(&this->m_registrations);
  std::lock_guard<std::shared_mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void parser_manager::clear() {
	std::lock_guard<std::shared_mutex> guard{ m_mutex };

	m_parsers.clear();
	m_registrations.clear();
}